

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1MB>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 (*pauVar14) [16];
  AABBNodeMB4D *node1;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive *prim;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  Precalculations pre;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  Precalculations local_1029;
  undefined1 local_1028 [16];
  ulong local_1010;
  RayHit *local_1008;
  RayQueryContext *local_1000;
  undefined1 (*local_ff8) [16];
  long local_ff0;
  undefined4 local_fe8;
  undefined4 uStack_fe4;
  undefined4 uStack_fe0;
  undefined4 uStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1000 = context;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return;
  }
  local_ff8 = (undefined1 (*) [16])local_f68;
  uStack_f70 = 0;
  aVar5 = (ray->super_RayK<1>).dir.field_0;
  auVar32 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  fVar3 = (ray->super_RayK<1>).tfar;
  auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar3));
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx((undefined1  [16])aVar5,auVar41);
  auVar45._8_4_ = 0x219392ef;
  auVar45._0_8_ = 0x219392ef219392ef;
  auVar45._12_4_ = 0x219392ef;
  auVar23 = vcmpps_avx(auVar23,auVar45,1);
  auVar23 = vblendvps_avx((undefined1  [16])aVar5,auVar45,auVar23);
  auVar41 = vrcpps_avx(auVar23);
  fVar10 = auVar41._0_4_;
  auVar34._0_4_ = auVar23._0_4_ * fVar10;
  fVar11 = auVar41._4_4_;
  auVar34._4_4_ = auVar23._4_4_ * fVar11;
  fVar12 = auVar41._8_4_;
  auVar34._8_4_ = auVar23._8_4_ * fVar12;
  fVar13 = auVar41._12_4_;
  auVar34._12_4_ = auVar23._12_4_ * fVar13;
  auVar46._8_4_ = 0x3f800000;
  auVar46._0_8_ = 0x3f8000003f800000;
  auVar46._12_4_ = 0x3f800000;
  auVar23 = vsubps_avx(auVar46,auVar34);
  auVar35._0_4_ = fVar10 + fVar10 * auVar23._0_4_;
  auVar35._4_4_ = fVar11 + fVar11 * auVar23._4_4_;
  auVar35._8_4_ = fVar12 + fVar12 * auVar23._8_4_;
  auVar35._12_4_ = fVar13 + fVar13 * auVar23._12_4_;
  local_fe8 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  uStack_fe4 = local_fe8;
  uStack_fe0 = local_fe8;
  uStack_fdc = local_fe8;
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_f88._4_4_ = uVar4;
  local_f88._0_4_ = uVar4;
  local_f88._8_4_ = uVar4;
  local_f88._12_4_ = uVar4;
  auVar48 = ZEXT1664(local_f88);
  uVar4 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_f98._4_4_ = uVar4;
  local_f98._0_4_ = uVar4;
  local_f98._8_4_ = uVar4;
  local_f98._12_4_ = uVar4;
  auVar49 = ZEXT1664(local_f98);
  local_fa8 = vshufps_avx(auVar35,auVar35,0);
  auVar50 = ZEXT1664(local_fa8);
  auVar23 = vmovshdup_avx(auVar35);
  local_fb8 = vshufps_avx(auVar35,auVar35,0x55);
  auVar51 = ZEXT1664(local_fb8);
  auVar41 = vshufpd_avx(auVar35,auVar35,1);
  uVar18 = (ulong)(auVar35._0_4_ < 0.0) << 4;
  local_fc8 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar52 = ZEXT1664(local_fc8);
  uVar20 = (ulong)(auVar23._0_4_ < 0.0) << 4 | 0x20;
  uVar21 = (ulong)(auVar41._0_4_ < 0.0) << 4 | 0x40;
  uVar17 = uVar18 ^ 0x10;
  local_fd8 = vshufps_avx(auVar32,auVar32,0);
  auVar53 = ZEXT1664(local_fd8);
  auVar23 = vshufps_avx(auVar27,auVar27,0);
  local_1008 = ray;
  local_1010 = uVar18;
  do {
    auVar26 = ZEXT464((uint)fVar3);
    auVar47 = ZEXT1664(CONCAT412(uStack_fdc,CONCAT48(uStack_fe0,CONCAT44(uStack_fe4,local_fe8))));
LAB_00b87750:
    do {
      if (local_ff8 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar14 = local_ff8 + -1;
      local_ff8 = local_ff8 + -1;
    } while (auVar26._0_4_ < *(float *)(*pauVar14 + 8));
    uVar19 = *(ulong *)*local_ff8;
LAB_00b87774:
    if ((uVar19 & 8) == 0) {
      uVar15 = uVar19 & 0xfffffffffffffff0;
      fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
      auVar24._4_4_ = fVar3;
      auVar24._0_4_ = fVar3;
      auVar24._8_4_ = fVar3;
      auVar24._12_4_ = fVar3;
      pfVar2 = (float *)(uVar15 + 0x80 + uVar18);
      pfVar1 = (float *)(uVar15 + 0x20 + uVar18);
      auVar32._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar32._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar32._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar32._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar32 = vsubps_avx(auVar32,auVar47._0_16_);
      auVar27._0_4_ = auVar50._0_4_ * auVar32._0_4_;
      auVar27._4_4_ = auVar50._4_4_ * auVar32._4_4_;
      auVar27._8_4_ = auVar50._8_4_ * auVar32._8_4_;
      auVar27._12_4_ = auVar50._12_4_ * auVar32._12_4_;
      pfVar2 = (float *)(uVar15 + 0x80 + uVar20);
      auVar32 = vmaxps_avx(auVar53._0_16_,auVar27);
      pfVar1 = (float *)(uVar15 + 0x20 + uVar20);
      auVar29._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar29._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar29._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar29._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar27 = vsubps_avx(auVar29,auVar48._0_16_);
      pfVar2 = (float *)(uVar15 + 0x80 + uVar21);
      pfVar1 = (float *)(uVar15 + 0x20 + uVar21);
      auVar36._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar36._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar36._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar36._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar30._0_4_ = auVar51._0_4_ * auVar27._0_4_;
      auVar30._4_4_ = auVar51._4_4_ * auVar27._4_4_;
      auVar30._8_4_ = auVar51._8_4_ * auVar27._8_4_;
      auVar30._12_4_ = auVar51._12_4_ * auVar27._12_4_;
      auVar27 = vsubps_avx(auVar36,auVar49._0_16_);
      auVar37._0_4_ = auVar52._0_4_ * auVar27._0_4_;
      auVar37._4_4_ = auVar52._4_4_ * auVar27._4_4_;
      auVar37._8_4_ = auVar52._8_4_ * auVar27._8_4_;
      auVar37._12_4_ = auVar52._12_4_ * auVar27._12_4_;
      auVar27 = vmaxps_avx(auVar30,auVar37);
      pfVar2 = (float *)(uVar15 + 0x80 + uVar17);
      pfVar1 = (float *)(uVar15 + 0x20 + uVar17);
      auVar38._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar38._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar38._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar38._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      local_1028 = vmaxps_avx(auVar32,auVar27);
      auVar32 = vsubps_avx(auVar38,auVar47._0_16_);
      auVar31._0_4_ = auVar50._0_4_ * auVar32._0_4_;
      auVar31._4_4_ = auVar50._4_4_ * auVar32._4_4_;
      auVar31._8_4_ = auVar50._8_4_ * auVar32._8_4_;
      auVar31._12_4_ = auVar50._12_4_ * auVar32._12_4_;
      auVar32 = vminps_avx(auVar23,auVar31);
      pfVar2 = (float *)(uVar15 + 0x80 + (uVar20 ^ 0x10));
      pfVar1 = (float *)(uVar15 + 0x20 + (uVar20 ^ 0x10));
      auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar27 = vsubps_avx(auVar39,auVar48._0_16_);
      auVar40._0_4_ = auVar51._0_4_ * auVar27._0_4_;
      auVar40._4_4_ = auVar51._4_4_ * auVar27._4_4_;
      auVar40._8_4_ = auVar51._8_4_ * auVar27._8_4_;
      auVar40._12_4_ = auVar51._12_4_ * auVar27._12_4_;
      pfVar2 = (float *)(uVar15 + 0x80 + (uVar21 ^ 0x10));
      pfVar1 = (float *)(uVar15 + 0x20 + (uVar21 ^ 0x10));
      auVar42._0_4_ = fVar3 * *pfVar2 + *pfVar1;
      auVar42._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
      auVar42._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
      auVar42._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
      auVar27 = vsubps_avx(auVar42,auVar49._0_16_);
      auVar43._0_4_ = auVar52._0_4_ * auVar27._0_4_;
      auVar43._4_4_ = auVar52._4_4_ * auVar27._4_4_;
      auVar43._8_4_ = auVar52._8_4_ * auVar27._8_4_;
      auVar43._12_4_ = auVar52._12_4_ * auVar27._12_4_;
      auVar27 = vminps_avx(auVar40,auVar43);
      auVar32 = vminps_avx(auVar32,auVar27);
      auVar32 = vcmpps_avx(local_1028,auVar32,2);
      if (((uint)uVar19 & 7) == 6) {
        auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0xe0),auVar24,2);
        auVar41 = vcmpps_avx(auVar24,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
        auVar27 = vandps_avx(auVar27,auVar41);
        auVar32 = vandps_avx(auVar27,auVar32);
      }
      auVar32 = vpslld_avx(auVar32,0x1f);
      uVar16 = vmovmskps_avx(auVar32);
      if (uVar16 != 0) {
        uVar16 = uVar16 & 0xff;
        lVar9 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar19 = *(ulong *)(uVar15 + lVar9 * 8);
        uVar16 = uVar16 - 1 & uVar16;
        if (uVar16 != 0) {
          uVar6 = *(uint *)(local_1028 + lVar9 * 4);
          lVar9 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
            }
          }
          uVar8 = *(ulong *)(uVar15 + lVar9 * 8);
          uVar7 = *(uint *)(local_1028 + lVar9 * 4);
          uVar16 = uVar16 - 1 & uVar16;
          if (uVar16 == 0) {
            if (uVar6 < uVar7) {
              *(ulong *)*local_ff8 = uVar8;
              *(uint *)(*local_ff8 + 8) = uVar7;
              local_ff8 = local_ff8 + 1;
            }
            else {
              *(ulong *)*local_ff8 = uVar19;
              *(uint *)(*local_ff8 + 8) = uVar6;
              local_ff8 = local_ff8 + 1;
              uVar19 = uVar8;
            }
          }
          else {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar19;
            auVar32 = vpunpcklqdq_avx(auVar25,ZEXT416(uVar6));
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar8;
            auVar27 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar7));
            lVar9 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            auVar33._8_8_ = 0;
            auVar33._0_8_ = *(ulong *)(uVar15 + lVar9 * 8);
            auVar34 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_1028 + lVar9 * 4)));
            auVar41 = vpcmpgtd_avx(auVar27,auVar32);
            uVar16 = uVar16 - 1 & uVar16;
            if (uVar16 == 0) {
              auVar35 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar27,auVar32,auVar35);
              auVar32 = vblendvps_avx(auVar32,auVar27,auVar35);
              auVar27 = vpcmpgtd_avx(auVar34,auVar41);
              auVar35 = vpshufd_avx(auVar27,0xaa);
              auVar27 = vblendvps_avx(auVar34,auVar41,auVar35);
              auVar41 = vblendvps_avx(auVar41,auVar34,auVar35);
              auVar34 = vpcmpgtd_avx(auVar41,auVar32);
              auVar35 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar41,auVar32,auVar35);
              auVar32 = vblendvps_avx(auVar32,auVar41,auVar35);
              *local_ff8 = auVar32;
              local_ff8[1] = auVar34;
              uVar19 = auVar27._0_8_;
              local_ff8 = local_ff8 + 2;
            }
            else {
              lVar9 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
                }
              }
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *(ulong *)(uVar15 + lVar9 * 8);
              auVar45 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_1028 + lVar9 * 4)));
              auVar35 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar27,auVar32,auVar35);
              auVar32 = vblendvps_avx(auVar32,auVar27,auVar35);
              auVar27 = vpcmpgtd_avx(auVar45,auVar34);
              auVar35 = vpshufd_avx(auVar27,0xaa);
              auVar27 = vblendvps_avx(auVar45,auVar34,auVar35);
              auVar34 = vblendvps_avx(auVar34,auVar45,auVar35);
              auVar35 = vpcmpgtd_avx(auVar34,auVar32);
              auVar45 = vpshufd_avx(auVar35,0xaa);
              auVar35 = vblendvps_avx(auVar34,auVar32,auVar45);
              auVar32 = vblendvps_avx(auVar32,auVar34,auVar45);
              auVar34 = vpcmpgtd_avx(auVar27,auVar41);
              auVar45 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar27,auVar41,auVar45);
              auVar27 = vblendvps_avx(auVar41,auVar27,auVar45);
              auVar41 = vpcmpgtd_avx(auVar35,auVar27);
              auVar45 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar35,auVar27,auVar45);
              auVar27 = vblendvps_avx(auVar27,auVar35,auVar45);
              *local_ff8 = auVar32;
              local_ff8[1] = auVar27;
              local_ff8[2] = auVar41;
              auVar47 = ZEXT1664(CONCAT412(uStack_fdc,
                                           CONCAT48(uStack_fe0,CONCAT44(uStack_fe4,local_fe8))));
              uVar19 = auVar34._0_8_;
              local_ff8 = local_ff8 + 3;
            }
          }
        }
        goto LAB_00b87774;
      }
      auVar32 = vmovshdup_avx(*(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 0xc))
      ;
      auVar26 = ZEXT1664(auVar32);
      goto LAB_00b87750;
    }
    local_ff0 = (ulong)((uint)uVar19 & 0xf) - 8;
    prim = (Primitive *)(uVar19 & 0xfffffffffffffff0);
    while (bVar22 = local_ff0 != 0, local_ff0 = local_ff0 + -1, bVar22) {
      InstanceArrayIntersector1MB::intersect(&local_1029,ray,local_1000,prim);
      auVar53 = ZEXT1664(local_fd8);
      auVar52 = ZEXT1664(local_fc8);
      auVar51 = ZEXT1664(local_fb8);
      auVar50 = ZEXT1664(local_fa8);
      auVar49 = ZEXT1664(local_f98);
      auVar48 = ZEXT1664(local_f88);
      prim = prim + 1;
      ray = local_1008;
      uVar18 = local_1010;
    }
    fVar3 = (ray->super_RayK<1>).tfar;
    auVar23._4_4_ = fVar3;
    auVar23._0_4_ = fVar3;
    auVar23._8_4_ = fVar3;
    auVar23._12_4_ = fVar3;
    fVar3 = (ray->super_RayK<1>).tfar;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }